

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O2

void mxx::impl::all2all_big<int>(int *msgs,size_t size,int *out,comm *comm)

{
  datatype dt;
  datatype dt_1;
  
  dt_1._vptr_datatype = (_func_int **)&PTR__datatype_00171c90;
  dt_1.mpitype = (MPI_Datatype)&ompi_mpi_int;
  dt_1.builtin = true;
  datatype::contiguous(&dt,&dt_1,size);
  datatype::~datatype(&dt_1);
  MPI_Alltoall(msgs,1,dt.mpitype,out,1,dt.mpitype,comm->mpi_comm);
  datatype::~datatype(&dt);
  return;
}

Assistant:

void all2all_big(const T* msgs, size_t size, T* out, const mxx::comm& comm = mxx::comm()) {
    mxx::datatype dt = mxx::get_datatype<T>().contiguous(size);
    MPI_Alltoall(const_cast<T*>(msgs), 1, dt.type(), out, 1, dt.type(), comm);
}